

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadDylinkSection(BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  undefined1 local_68 [8];
  string_view so_name;
  uint32_t local_4c;
  Enum local_48;
  uint32_t count;
  Enum local_40;
  Enum local_3c;
  Enum local_38;
  uint local_34;
  uint local_30;
  uint32_t table_align;
  uint32_t table_size;
  uint32_t mem_align;
  uint32_t mem_size;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _mem_size = section_size;
  section_size_local = (Offset)this;
  mem_align = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb9])(this->delegate_,section_size);
  bVar1 = Succeeded((Result)mem_align);
  if (bVar1) {
    local_38 = (Enum)ReadU32Leb128(this,&table_size,"mem_size");
    bVar1 = Failed((Result)local_38);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      local_3c = (Enum)ReadU32Leb128(this,&table_align,"mem_align");
      bVar1 = Failed((Result)local_3c);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        local_40 = (Enum)ReadU32Leb128(this,&local_30,"table_size");
        bVar1 = Failed((Result)local_40);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          count = (uint32_t)ReadU32Leb128(this,&local_34,"table_align");
          bVar1 = Failed((Result)count);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
          else {
            local_48 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xba])
                                 (this->delegate_,(ulong)table_size,(ulong)table_align,
                                  (ulong)local_30,(ulong)local_34);
            bVar1 = Succeeded((Result)local_48);
            if (bVar1) {
              RVar2 = ReadU32Leb128(this,&local_4c,"needed_dynlibs");
              bVar1 = Failed(RVar2);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
              }
              else {
                so_name._M_str._4_4_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbf])();
                bVar1 = Succeeded(so_name._M_str._4_4_);
                if (bVar1) {
                  do {
                    if (local_4c == 0) {
                      local_4c = local_4c - 1;
                      RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc1])();
                      bVar1 = Succeeded(RVar2);
                      if (!bVar1) {
                        PrintError(this,"EndDylinkSection callback failed");
                        Result::Result((Result *)((long)&this_local + 4),Error);
                        return (Result)this_local._4_4_;
                      }
                      Result::Result((Result *)((long)&this_local + 4),Ok);
                      return (Result)this_local._4_4_;
                    }
                    local_4c = local_4c - 1;
                    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_68);
                    RVar2 = ReadStr(this,(string_view *)local_68,"dylib so_name");
                    bVar1 = Failed(RVar2);
                    if (bVar1) {
                      Result::Result((Result *)((long)&this_local + 4),Error);
                      return (Result)this_local._4_4_;
                    }
                    RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc0])
                                            (this->delegate_,local_68,so_name._M_len);
                    bVar1 = Succeeded(RVar2);
                  } while (bVar1);
                  PrintError(this,"OnDylinkNeeded callback failed");
                  Result::Result((Result *)((long)&this_local + 4),Error);
                }
                else {
                  PrintError(this,"OnDylinkNeededCount callback failed");
                  Result::Result((Result *)((long)&this_local + 4),Error);
                }
              }
            }
            else {
              PrintError(this,"OnDylinkInfo callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
            }
          }
        }
      }
    }
  }
  else {
    PrintError(this,"BeginDylinkSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadDylinkSection(Offset section_size) {
  CALLBACK(BeginDylinkSection, section_size);
  uint32_t mem_size;
  uint32_t mem_align;
  uint32_t table_size;
  uint32_t table_align;

  CHECK_RESULT(ReadU32Leb128(&mem_size, "mem_size"));
  CHECK_RESULT(ReadU32Leb128(&mem_align, "mem_align"));
  CHECK_RESULT(ReadU32Leb128(&table_size, "table_size"));
  CHECK_RESULT(ReadU32Leb128(&table_align, "table_align"));
  CALLBACK(OnDylinkInfo, mem_size, mem_align, table_size, table_align);

  uint32_t count;
  CHECK_RESULT(ReadU32Leb128(&count, "needed_dynlibs"));
  CALLBACK(OnDylinkNeededCount, count);
  while (count--) {
    std::string_view so_name;
    CHECK_RESULT(ReadStr(&so_name, "dylib so_name"));
    CALLBACK(OnDylinkNeeded, so_name);
  }

  CALLBACK0(EndDylinkSection);
  return Result::Ok;
}